

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O0

void anon_unknown.dwarf_2860d0::seterror(cppcms_capi_exception *c,int code,exception *e)

{
  char *pcVar1;
  undefined8 uVar2;
  long *in_RDX;
  int in_ESI;
  int *in_RDI;
  
  if (*in_RDI == 0) {
    *in_RDI = in_ESI;
    pcVar1 = (char *)(**(code **)(*in_RDX + 0x10))();
    std::__cxx11::string::operator=((string *)(in_RDI + 4),pcVar1);
    uVar2 = std::__cxx11::string::c_str();
    *(undefined8 *)(in_RDI + 2) = uVar2;
  }
  return;
}

Assistant:

void seterror(cppcms_capi_exception &c,int code,std::exception const &e) 
	{
		if(c.code)
			return;
		c.code = code;
		try {
			c.s_msg = e.what();
			c.msg = c.s_msg.c_str();
		}
		catch(...) {
			strncpy(c.c_msg,e.what(),sizeof(c.c_msg)-1);
			c.msg = c.c_msg;
		}
	}